

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O0

int rxa2_allocate_memory(argon2_context *context,uint8_t **memory,size_t num,size_t size)

{
  ulong __size;
  void *pvVar1;
  ulong in_RCX;
  ulong in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t memory_size;
  undefined4 local_4;
  
  __size = in_RDX * in_RCX;
  if (in_RSI == (long *)0x0) {
    local_4 = -0x16;
  }
  else if ((in_RCX == 0) || (__size / in_RCX == in_RDX)) {
    if (*(long *)(in_RDI + 0x60) == 0) {
      pvVar1 = malloc(__size);
      *in_RSI = (long)pvVar1;
    }
    else {
      (**(code **)(in_RDI + 0x60))(in_RSI,__size);
    }
    if (*in_RSI == 0) {
      local_4 = -0x16;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int rxa2_allocate_memory(const argon2_context *context, uint8_t **memory,
	size_t num, size_t size) {
	size_t memory_size = num * size;
	if (memory == NULL) {
		return ARGON2_MEMORY_ALLOCATION_ERROR;
	}

	/* 1. Check for multiplication overflow */
	if (size != 0 && memory_size / size != num) {
		return ARGON2_MEMORY_ALLOCATION_ERROR;
	}

	/* 2. Try to allocate with appropriate allocator */
	if (context->allocate_cbk) {
		(context->allocate_cbk)(memory, memory_size);
	}
	else {
		*memory = (uint8_t*)malloc(memory_size);
	}

	if (*memory == NULL) {
		return ARGON2_MEMORY_ALLOCATION_ERROR;
	}

	return ARGON2_OK;
}